

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Synthesizer.cpp
# Opt level: O0

void __thiscall Synthesizer::Voice::Process(Voice *this,float *l,float *r)

{
  int iVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float local_2c;
  float ramped_amp;
  float bw;
  float cut;
  float *r_local;
  float *l_local;
  Voice *this_local;
  
  fVar2 = FastClip(this->p[2] * this->fenv + this->p[1],0.0001,0.99);
  fVar2 = fVar2 * fVar2 * 0.707;
  fVar3 = 1.0 - this->p[3];
  fVar3 = fVar3 * fVar3;
  local_2c = this->aenv * this->amp;
  if (this->rampcount < 0x40) {
    iVar1 = this->rampcount + 1;
    this->rampcount = iVar1;
    local_2c = (float)iVar1 * 0.015625 * local_2c;
  }
  fVar4 = VoiceChannel::Process(this->channels,fVar2,fVar3);
  *l = fVar4 * local_2c + *l;
  fVar2 = VoiceChannel::Process(this->channels + 1,fVar2,fVar3);
  *r = fVar2 * local_2c + *r;
  this->aenv = this->aenv * this->aenvdecay + 1e-11;
  this->fenv = this->fenv * this->fenvdecay + 1e-11;
  return;
}

Assistant:

inline void Process(float& l, float& r)
        {
            float cut = FastClip(p[P_CUTOFF] + p[P_CUTENV] * fenv, 0.0001f, 0.99f); cut = cut * cut * 0.707f;
            float bw = 1.0f - p[P_RESONANCE]; bw *= bw;
            float ramped_amp = aenv * amp;
            if (rampcount < RAMPSAMPLES)
                ramped_amp *= (++rampcount) * RAMPSCALE;
            l += channels[0].Process(cut, bw) * ramped_amp;
            r += channels[1].Process(cut, bw) * ramped_amp;
            aenv = aenv * aenvdecay + 1.0e-11f;
            fenv = fenv * fenvdecay + 1.0e-11f;
        }